

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ExpressionResultBuilder::ExprComponents::~ExprComponents(ExprComponents *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->op)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->op).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->rhs)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->rhs).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->lhs)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->lhs).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ExprComponents() : shouldNegate( false ) {}